

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

Level * LoadLevel(char *name,int radius)

{
  Vertex *pVVar1;
  Vertex *pVVar2;
  Vertex *pVVar3;
  Triangle *NewTri;
  Object *NewObject;
  undefined1 auVar4 [16];
  long lVar5;
  bool bVar6;
  int iVar7;
  ALLEGRO_FILE *pAVar8;
  Level *NewLev;
  Vertex **ppVVar9;
  Edge *pEVar10;
  ALLEGRO_BITMAP *pAVar11;
  ALLEGRO_SAMPLE *pAVar12;
  LevelState *pLVar13;
  Edge *pEVar14;
  long lVar15;
  long lVar16;
  Edge **ppEVar17;
  long lVar18;
  Edge **ppEVar19;
  Triangle **ppTVar20;
  Object **ppOVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dStack_40;
  
  Error = 0;
  ErrorText._0_4_ = ErrorText._0_4_ & 0xffffff00;
  Lines = 1;
  pAVar8 = (ALLEGRO_FILE *)al_fopen(name,"r");
  input = pAVar8;
  if (pAVar8 == (ALLEGRO_FILE *)0x0) {
    snprintf(ErrorText,0x400,"Unable to load %s",name);
    return (Level *)0x0;
  }
  NewLev = NewLevel();
  LoadMaterials(NewLev);
  if (((Error == 0) && (LoadVertices(NewLev), Error == 0)) &&
     (LoadTriangles(NewLev,radius), Error == 0)) {
    dVar26 = (double)radius;
    ppEVar17 = &NewLev->AllEdges;
    auVar4._8_4_ = SUB84(dVar26,0);
    auVar4._0_8_ = dVar26;
    auVar4._12_4_ = (int)((ulong)dVar26 >> 0x20);
    ppVVar9 = &NewLev->AllVerts;
    do {
      while (pVVar1 = *ppVVar9, pVVar1 != (Vertex *)0x0) {
        pEVar14 = pVVar1->Edges[0];
        pEVar10 = pVVar1->Edges[1];
        if (pEVar10 == (Edge *)0x0) {
          if (pEVar14 != (Edge *)0x0) {
            dVar24 = dVar26;
            if (pEVar14->EndPoints[0] != pVVar1) {
              dVar24 = -dVar26;
            }
            pVVar1->Normal[0] = pEVar14->b * dVar24 + pEVar14->a * dVar26 + pVVar1->Pos[0];
            dVar24 = (pEVar14->b * dVar26 + pVVar1->Pos[1]) - dVar24 * pEVar14->a;
            goto LAB_0010c76a;
          }
        }
        else {
          pVVar2 = pEVar14->EndPoints[0];
          dVar24 = pEVar14->a;
          pVVar3 = pEVar14->EndPoints[1];
          dStack_40 = auVar4._8_8_;
          dVar25 = dVar24 * dVar26 + pVVar2->Pos[0];
          dVar27 = pEVar10->c +
                   pEVar10->a * dVar25 + pEVar10->b * (pEVar14->b * dVar26 + pVVar2->Pos[1]);
          dVar28 = dVar27 - (pEVar10->c +
                            pEVar10->a * (dVar24 * dStack_40 + pVVar3->Pos[0]) +
                            pEVar10->b * (pEVar14->b * dStack_40 + pVVar3->Pos[1]));
          if ((dVar28 != 0.0) || (NAN(dVar28))) {
            dVar27 = dVar27 / dVar28;
            pVVar1->Normal[0] = (pVVar3->Pos[0] - pVVar2->Pos[0]) * dVar27 + dVar25;
            dVar24 = (pVVar3->Pos[1] - pVVar2->Pos[1]) * dVar27 +
                     pEVar14->b * dVar26 + pVVar2->Pos[1];
          }
          else {
            pVVar1->Normal[0] = dVar24 * dVar26 + pVVar1->Pos[0];
            dVar24 = pEVar14->b * dVar26 + pVVar1->Pos[1];
          }
LAB_0010c76a:
          pVVar1->Normal[1] = dVar24;
        }
        ppVVar9 = &pVVar1->Next;
      }
      bVar6 = false;
      ppEVar19 = ppEVar17;
      while (pEVar14 = *ppEVar19, pEVar14 != (Edge *)0x0) {
        dVar24 = pEVar14->a;
        dVar25 = pEVar14->b;
        iVar7 = GetNormal(pEVar14,pEVar14->EndPoints[0]->Normal,pEVar14->EndPoints[1]->Normal);
        pEVar14 = *ppEVar19;
        if ((iVar7 != 0) || (dVar24 * pEVar14->a + dVar25 * pEVar14->b < 0.0)) {
          pEVar10 = pEVar14->EndPoints[1]->Edges[0];
          if (pEVar10 == pEVar14) {
            pEVar10 = pEVar14->EndPoints[1]->Edges[1];
          }
          pVVar1 = pEVar14->EndPoints[0];
          if (pVVar1->Edges[0] == pEVar14) {
            if (pEVar10 == (Edge *)0x0) {
              pVVar1->Edges[0] = pVVar1->Edges[1];
              (*ppEVar19)->EndPoints[0]->Edges[1] = (Edge *)0x0;
            }
            else {
              pVVar1->Edges[0] = pEVar10;
            }
          }
          else {
            pVVar1->Edges[1] = pEVar10;
          }
          pEVar10->EndPoints[pEVar10->EndPoints[0] != (*ppEVar19)->EndPoints[1]] =
               (*ppEVar19)->EndPoints[0];
          (*ppEVar19)->EndPoints[1]->Edges[1] = (Edge *)0x0;
          (*ppEVar19)->EndPoints[1]->Edges[0] = (Edge *)0x0;
          pEVar14 = *ppEVar19;
          *ppEVar19 = pEVar14->Next;
          free(pEVar14);
          pEVar14 = *ppEVar19;
          bVar6 = true;
          if (pEVar14 == (Edge *)0x0) {
            bVar6 = true;
            break;
          }
        }
        ppEVar19 = &pEVar14->Next;
      }
      ppVVar9 = &NewLev->AllVerts;
    } while (bVar6);
    while (pEVar14 = *ppEVar17, pEVar14 != (Edge *)0x0) {
      pVVar1 = pEVar14->EndPoints[0];
      pVVar2 = pEVar14->EndPoints[1];
      dVar26 = pVVar1->Normal[0];
      uVar22 = SUB84(dVar26,0);
      uVar23 = (undefined4)((ulong)dVar26 >> 0x20);
      dVar24 = pVVar2->Normal[0];
      if (dVar24 <= dVar26) {
        uVar22 = SUB84(dVar24,0);
        uVar23 = (undefined4)((ulong)dVar24 >> 0x20);
      }
      (pEVar14->Bounder).TL.Pos[0] = (double)CONCAT44(uVar23,uVar22) + -0.05000000074505806;
      dVar26 = pVVar1->Normal[1];
      uVar22 = SUB84(dVar26,0);
      uVar23 = (undefined4)((ulong)dVar26 >> 0x20);
      dVar24 = pVVar2->Normal[1];
      if (dVar24 <= dVar26) {
        uVar22 = SUB84(dVar24,0);
        uVar23 = (undefined4)((ulong)dVar24 >> 0x20);
      }
      (pEVar14->Bounder).TL.Pos[1] = (double)CONCAT44(uVar23,uVar22) + -0.05000000074505806;
      dVar26 = pVVar1->Normal[0];
      uVar22 = SUB84(dVar26,0);
      uVar23 = (undefined4)((ulong)dVar26 >> 0x20);
      dVar24 = pVVar2->Normal[0];
      if (dVar26 <= dVar24) {
        uVar22 = SUB84(dVar24,0);
        uVar23 = (undefined4)((ulong)dVar24 >> 0x20);
      }
      (pEVar14->Bounder).BR.Pos[0] = (double)CONCAT44(uVar23,uVar22) + 0.05000000074505806;
      dVar26 = pVVar1->Normal[1];
      uVar22 = SUB84(dVar26,0);
      uVar23 = (undefined4)((ulong)dVar26 >> 0x20);
      dVar24 = pVVar2->Normal[1];
      if (dVar26 <= dVar24) {
        uVar22 = SUB84(dVar24,0);
        uVar23 = (undefined4)((ulong)dVar24 >> 0x20);
      }
      (pEVar14->Bounder).BR.Pos[1] = (double)CONCAT44(uVar23,uVar22) + 0.05000000074505806;
      AddEdge(NewLev,pEVar14);
      ppEVar17 = &pEVar14->Next;
    }
    LoadObjectTypes(NewLev,radius);
    if (Error == 0) {
      pAVar11 = ObtainBitmap("dooropen");
      NewLev->DoorOpen = pAVar11;
      if (pAVar11 == (ALLEGRO_BITMAP *)0x0) {
        builtin_strncpy(ErrorText + 0x10," dooropen sprite",0x10);
      }
      else {
        pAVar11 = ObtainBitmap("doorshut");
        NewLev->DoorShut = pAVar11;
        if (pAVar11 != (ALLEGRO_BITMAP *)0x0) {
          (NewLev->Door).Image = pAVar11;
          pAVar12 = ObtainSample("dooropen");
          (NewLev->Door).CollectNoise = pAVar12;
          (NewLev->Door).Radius = radius + 0xe;
          NewLev->TotalObjects = 0;
          LoadObjects(NewLev);
          if (Error == 0) {
            ppTVar20 = &NewLev->AllTris;
LAB_0010c8cb:
            NewTri = *ppTVar20;
            if (NewTri != (Triangle *)0x0) {
              pVVar1 = NewTri->Edges[0];
              dVar26 = pVVar1->Pos[0];
              uVar22 = SUB84(dVar26,0);
              uVar23 = (undefined4)((ulong)dVar26 >> 0x20);
              (NewTri->Bounder).BR.Pos[0] = dVar26;
              (NewTri->Bounder).TL.Pos[0] = dVar26;
              dVar24 = pVVar1->Pos[1];
              (NewTri->Bounder).BR.Pos[1] = dVar24;
              (NewTri->Bounder).TL.Pos[1] = dVar24;
              lVar16 = 3;
              dVar25 = dVar24;
              dVar27 = dVar24;
LAB_0010c90a:
              do {
                lVar15 = (lVar16 << 0x20) + -0x200000000;
                lVar5 = lVar16;
                do {
                  lVar16 = lVar5 + -1;
                  if (lVar16 == -1) {
                    AddTriangle(NewLev,NewTri);
                    ppTVar20 = &NewTri->Next;
                    goto LAB_0010c8cb;
                  }
                  pVVar1 = NewTri->Edges[lVar5 + -1];
                  dVar28 = pVVar1->Pos[0];
                  if (dVar28 < dVar26) {
                    (NewTri->Bounder).TL.Pos[0] = dVar28;
                    dVar26 = dVar28;
                    dVar28 = pVVar1->Pos[0];
                  }
                  if ((double)CONCAT44(uVar23,uVar22) <= dVar28 &&
                      dVar28 != (double)CONCAT44(uVar23,uVar22)) {
                    (NewTri->Bounder).BR.Pos[0] = dVar28;
                    uVar22 = SUB84(dVar28,0);
                    uVar23 = (undefined4)((ulong)dVar28 >> 0x20);
                  }
                  if (-1 < (char)NewTri->EdgeFlags[lVar5 + -1]) {
                    lVar18 = lVar15 >> 0x20;
                    if (lVar16 == 0) {
                      lVar18 = 2;
                    }
                    if ((NewTri->EdgeFlags[lVar18] & 0x80) == 0) {
                      dVar28 = pVVar1->Pos[1];
                      if (dVar28 < dVar25) {
                        (NewTri->Bounder).TL.Pos[1] = dVar28;
                        dVar25 = dVar28;
                        dVar28 = pVVar1->Pos[1];
                      }
                      dVar27 = dVar25;
                      if (dVar28 <= dVar24) goto LAB_0010c90a;
                      break;
                    }
                  }
                  dVar28 = pVVar1->Pos[1];
                  dVar29 = (double)(NewTri->EdgeFlags[lVar5 + -1] & 0x7f);
                  dVar30 = dVar28 - dVar29;
                  if (dVar30 < dVar27) {
                    (NewTri->Bounder).TL.Pos[1] = dVar30;
                    dVar28 = pVVar1->Pos[1];
                    dVar27 = dVar30;
                    dVar25 = dVar30;
                  }
                  dVar28 = dVar28 + dVar29;
                  lVar15 = lVar15 + -0x100000000;
                  lVar5 = lVar16;
                } while (dVar28 <= dVar24);
                dVar24 = dVar28;
                (NewTri->Bounder).BR.Pos[1] = dVar24;
              } while( true );
            }
            ppOVar21 = &NewLev->AllObjects;
            while (NewObject = *ppOVar21, NewObject != (Object *)0x0) {
              dVar26 = (double)NewObject->ObjType->Radius;
              dVar24 = NewObject->Pos[0];
              dVar25 = NewObject->Pos[1];
              (NewObject->Bounder).BR.Pos[0] = dVar24 + dVar26;
              (NewObject->Bounder).BR.Pos[1] = dVar25 + dVar26;
              (NewObject->Bounder).TL.Pos[0] = dVar24 - dVar26;
              (NewObject->Bounder).TL.Pos[1] = dVar25 - dVar26;
              AddObject(NewLev,NewObject,0);
              AddObject(NewLev,NewObject,1);
              ppOVar21 = &NewObject->Next;
            }
            SplitTree(&NewLev->DisplayTree);
            OrderTree(&NewLev->DisplayTree,0);
            OrderTree(&NewLev->DisplayTree,1);
            OrderTree(&NewLev->CollisionTree,0);
            LoadStats(NewLev);
            if (Error == 0) {
              pLVar13 = BorrowState(NewLev);
              NewLev->InitialState = pLVar13;
              return NewLev;
            }
          }
          goto LAB_0010ca60;
        }
        builtin_strncpy(ErrorText + 0x10," doorshut sprite",0x10);
      }
      builtin_strncpy(ErrorText,"Unable to obtain",0x10);
      ErrorText[0x20] = '\0';
    }
  }
LAB_0010ca60:
  al_fclose(pAVar8);
  if (NewLev != (Level *)0x0) {
    FreeLevel(NewLev);
  }
  return (Level *)0x0;
}

Assistant:

struct Level *LoadLevel(char const *name, int radius)
{
   ALLEGRO_FILE *file;
   struct Level *NewLev = NULL;

   ErrorText[0] = '\0';         /* set ErrorText to be a zero length string
                                   so that it will be obvious later if anything has set the error flag
                                   but not produced a verbose explanation of the error */
   Error = 0;                   /* reset error flag as no error has occurred yet */
   Lines = 1;                   /* first line is line 1 */

   /* attempt to open named level file */
   file = al_fopen(name, "r");
   input = file;

   if (!input) {
      snprintf(ErrorText, sizeof(ErrorText), "Unable to load %s", name);
      goto error;
   }

   /* allocate and initially set up new level structure */
   NewLev = NewLevel();

   /* load materials, vertices & triangles in that order */
   LoadMaterials(NewLev);
   if (Error) {
      goto error;
   }
   LoadVertices(NewLev);
   if (Error) {
      goto error;
   }
   LoadTriangles(NewLev, radius);
   if (Error) {
      goto error;
   }

   /* do a repeat 'fix' of vertices and fix of edges until we have
      no edge errors - see algorithm descriptions elsewhere in this
      file */
   do
      FixVerts(NewLev, radius);
   while (FixEdges(NewLev, radius));

   /* now that edges are al_fixed, add them to the collision tree */
   AddEdges(NewLev);

   /* load ordinary object types */
   LoadObjectTypes(NewLev, radius);
   if (Error) {
      goto error;
   }

   /* load special case object: door */
   if (!(NewLev->DoorOpen = ObtainBitmap("dooropen"))) {
      snprintf(ErrorText, sizeof(ErrorText),
                "Unable to obtain dooropen sprite");
      goto error;
   }
   if (!(NewLev->DoorShut = ObtainBitmap("doorshut"))) {
      snprintf(ErrorText, sizeof(ErrorText),
                "Unable to obtain doorshut sprite");
      goto error;
   }
   NewLev->Door.Image = NewLev->DoorShut;
   NewLev->Door.CollectNoise = ObtainSample("dooropen");
   NewLev->Door.Radius = 14 + radius;

   /* load objects */
   NewLev->TotalObjects = 0;
   LoadObjects(NewLev);
   if (Error) {
      goto error;
   }

   /* complete display tree additions */
   AddTriangles(NewLev);
   ScaleAndAddObjects(NewLev);

   /* order things for drawing */
   SplitTree(&NewLev->DisplayTree);
   OrderTree(&NewLev->DisplayTree, false);
   OrderTree(&NewLev->DisplayTree, true);
   OrderTree(&NewLev->CollisionTree, false);

   /* load static level stuff - player start pos, etc */
   LoadStats(NewLev);
   if (Error) {
      goto error;
   }

   /* make a copy of the initial state */
   NewLev->InitialState = BorrowState(NewLev);

   /* return level */
   return NewLev;

error:
   /* close input file */
   if (file)
      al_fclose(file);

   if (NewLev)
      FreeLevel(NewLev);

   return NULL;
}